

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_rar.c
# Opt level: O0

void test_read_format_rar_multivolume_test_body_helper(archive *a)

{
  int iVar1;
  mode_t mVar2;
  wchar_t wVar3;
  char *pcVar4;
  time_t tVar5;
  la_int64_t lVar6;
  la_ssize_t lVar7;
  long lVar8;
  archive_entry *local_4fa0;
  archive_entry *ae;
  char file3_test_txt [21];
  undefined1 local_4f78 [4];
  int file3_size;
  char file3_buff [20];
  undefined1 local_4f58 [8];
  char file2_test_txt [56];
  undefined1 local_4f18 [4];
  int file2_size;
  char file2_buff [20111];
  char file1_test_txt [43];
  char buff [64];
  int offset;
  int file1_size;
  archive *a_local;
  
  buff[0x38] = '\0';
  buff[0x39] = '\0';
  buff[0x3a] = '\0';
  buff[0x3b] = '\0';
  memcpy(file2_buff + 0x4e88,"gin-bottom: 0in\"><BR>\n</P>\n</BODY>\n</HTML>",0x2b);
  file2_test_txt[0x34] = -0x71;
  file2_test_txt[0x35] = 'N';
  file2_test_txt[0x36] = '\0';
  file2_test_txt[0x37] = '\0';
  memcpy(local_4f58,"<P STYLE=\"margin-bottom: 0in\"><BR>\n</P>\n</BODY>\n</HTML>",0x38);
  stack0xffffffffffffb084 = 0x14;
  ae = (archive_entry *)0x7865742074736574;
  file3_test_txt[0] = 't';
  file3_test_txt[1] = ' ';
  file3_test_txt[2] = 'd';
  file3_test_txt[3] = 'o';
  file3_test_txt[4] = 'c';
  file3_test_txt[5] = 'u';
  file3_test_txt[6] = 'm';
  file3_test_txt[7] = 'e';
  file3_test_txt[8] = 'n';
  file3_test_txt[9] = 't';
  file3_test_txt[10] = '\r';
  file3_test_txt[0xb] = '\n';
  file3_test_txt[0xc] = '\0';
  iVar1 = archive_read_next_header(a,&local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'΍',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_4fa0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'Ώ',"ppmd_lzss_conversion_test.txt","\"ppmd_lzss_conversion_test.txt\"",pcVar4,
             "archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ΐ',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
  tVar5 = archive_entry_ctime(local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'Α',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a);
  tVar5 = archive_entry_atime(local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'Β',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a);
  lVar6 = archive_entry_size(local_4fa0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'Γ',0xe67416a,"file1_size",lVar6,"archive_entry_size(ae)",(void *)0x0);
  mVar2 = archive_entry_mode(local_4fa0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'Δ',0x81a4,"33188",(ulong)mVar2,"archive_entry_mode(ae)",(void *)0x0);
  wVar3 = archive_entry_is_encrypted(local_4fa0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'Ε',(long)wVar3,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'Ζ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
  for (; buff._56_4_ + 0x40 < 0xe67416a; buff._56_4_ = buff._56_4_ + 0x40) {
    lVar7 = archive_read_data(a,file1_test_txt + 0x28,0x40);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'Ι',(uint)(lVar7 == 0x40),
                     "sizeof(buff) == archive_read_data(a, buff, sizeof(buff))",a);
  }
  lVar7 = archive_read_data(a,file1_test_txt + 0x28,(long)(0xe67416a - buff._56_4_));
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'Ν',(uint)(0xe67416a - buff._56_4_ == lVar7),
                   "file1_size - offset == archive_read_data(a, buff, file1_size - offset)",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'Ξ',file1_test_txt + 0x28,"buff",file2_buff + 0x4e88,"file1_test_txt",
                      (long)(0xe67416a - buff._56_4_),"file1_size - offset",(void *)0x0);
  iVar1 = archive_read_next_header(a,&local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'Ρ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_4fa0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'΢',"LibarchiveAddingTest.html","\"LibarchiveAddingTest.html\"",pcVar4,
             "archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'Σ',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
  tVar5 = archive_entry_ctime(local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'Τ',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a);
  tVar5 = archive_entry_atime(local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'Υ',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a);
  lVar8 = (long)(int)file2_test_txt._52_4_;
  lVar6 = archive_entry_size(local_4fa0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'Φ',lVar8,"file2_size",lVar6,"archive_entry_size(ae)",(void *)0x0);
  mVar2 = archive_entry_mode(local_4fa0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'Χ',0x81a4,"33188",(ulong)mVar2,"archive_entry_mode(ae)",(void *)0x0);
  wVar3 = archive_entry_is_encrypted(local_4fa0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'Ψ',(long)wVar3,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'Ω',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
  lVar8 = (long)(int)file2_test_txt._52_4_;
  lVar7 = archive_read_data(a,local_4f18,(long)(int)file2_test_txt._52_4_);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'Ϊ',(uint)(lVar8 == lVar7),
                   "file2_size == archive_read_data(a, file2_buff, file2_size)",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ά',file2_test_txt + (long)(int)file2_test_txt._52_4_ + 1,
                      "&file2_buff[file2_size - sizeof(file2_test_txt) + 1]",local_4f58,
                      "file2_test_txt",0x37,"sizeof(file2_test_txt) - 1",(void *)0x0);
  iVar1 = archive_read_next_header(a,&local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ί',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_4fa0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'ΰ',"testlink","\"testlink\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0')
  ;
  tVar5 = archive_entry_mtime(local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'α',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
  tVar5 = archive_entry_ctime(local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'β',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a);
  tVar5 = archive_entry_atime(local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'γ',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a);
  lVar6 = archive_entry_size(local_4fa0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'δ',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
  mVar2 = archive_entry_mode(local_4fa0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ε',0xa1ff,"41471",(ulong)mVar2,"archive_entry_mode(ae)",(void *)0x0);
  wVar3 = archive_entry_is_encrypted(local_4fa0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ζ',(long)wVar3,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'η',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
  pcVar4 = archive_entry_symlink(local_4fa0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'θ',"LibarchiveAddingTest.html","\"LibarchiveAddingTest.html\"",pcVar4,
             "archive_entry_symlink(ae)",(void *)0x0,L'\0');
  lVar7 = archive_read_data(a,local_4f18,0x1e);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ι',0,"0",lVar7,"archive_read_data(a, file2_buff, 30)",a);
  iVar1 = archive_read_next_header(a,&local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'μ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_4fa0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'ν',"testdir/test.txt","\"testdir/test.txt\"",pcVar4,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ξ',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
  tVar5 = archive_entry_ctime(local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ο',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a);
  tVar5 = archive_entry_atime(local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'π',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a);
  lVar8 = (long)stack0xffffffffffffb084;
  lVar6 = archive_entry_size(local_4fa0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ρ',lVar8,"file3_size",lVar6,"archive_entry_size(ae)",(void *)0x0);
  mVar2 = archive_entry_mode(local_4fa0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ς',0x81a4,"33188",(ulong)mVar2,"archive_entry_mode(ae)",(void *)0x0);
  wVar3 = archive_entry_is_encrypted(local_4fa0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'σ',(long)wVar3,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'τ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
  lVar8 = (long)stack0xffffffffffffb084;
  lVar7 = archive_read_data(a,local_4f78,(long)stack0xffffffffffffb084);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'υ',(uint)(lVar8 == lVar7),
                   "file3_size == archive_read_data(a, file3_buff, file3_size)",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'χ',file3_test_txt + (long)(stack0xffffffffffffb084 + 1) + 3,
                      "&file3_buff[file3_size + 1 - sizeof(file3_test_txt)]",&ae,"file3_test_txt",
                      0x14,"sizeof(file3_test_txt) - 1",(void *)0x0);
  iVar1 = archive_read_next_header(a,&local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ϊ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_4fa0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'ό',"testdir/LibarchiveAddingTest.html","\"testdir/LibarchiveAddingTest.html\"",
             pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ύ',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
  tVar5 = archive_entry_ctime(local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ώ',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a);
  tVar5 = archive_entry_atime(local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'Ϗ',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a);
  lVar8 = (long)(int)file2_test_txt._52_4_;
  lVar6 = archive_entry_size(local_4fa0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ϐ',lVar8,"file2_size",lVar6,"archive_entry_size(ae)",(void *)0x0);
  mVar2 = archive_entry_mode(local_4fa0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ϑ',0x81a4,"33188",(ulong)mVar2,"archive_entry_mode(ae)",(void *)0x0);
  wVar3 = archive_entry_is_encrypted(local_4fa0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ϒ',(long)wVar3,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ϓ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
  lVar8 = (long)(int)file2_test_txt._52_4_;
  lVar7 = archive_read_data(a,local_4f18,(long)(int)file2_test_txt._52_4_);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ϔ',(uint)(lVar8 == lVar7),
                   "file2_size == archive_read_data(a, file2_buff, file2_size)",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ϖ',file2_test_txt + (long)(int)file2_test_txt._52_4_ + 1,
                      "&file2_buff[file2_size - sizeof(file2_test_txt) + 1]",local_4f58,
                      "file2_test_txt",0x37,"sizeof(file2_test_txt) - 1",(void *)0x0);
  iVar1 = archive_read_next_header(a,&local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ϙ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_4fa0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'Ϛ',"testdir","\"testdir\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ϛ',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
  tVar5 = archive_entry_ctime(local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'Ϝ',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a);
  tVar5 = archive_entry_atime(local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ϝ',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a);
  lVar6 = archive_entry_size(local_4fa0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'Ϟ',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
  mVar2 = archive_entry_mode(local_4fa0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ϟ',0x41ed,"16877",(ulong)mVar2,"archive_entry_mode(ae)",(void *)0x0);
  wVar3 = archive_entry_is_encrypted(local_4fa0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'Ϡ',(long)wVar3,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ϡ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
  iVar1 = archive_read_next_header(a,&local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'Ϥ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_4fa0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'ϥ',"testemptydir","\"testemptydir\"",pcVar4,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'Ϧ',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
  tVar5 = archive_entry_ctime(local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ϧ',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a);
  tVar5 = archive_entry_atime(local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'Ϩ',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a);
  lVar6 = archive_entry_size(local_4fa0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ϩ',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
  mVar2 = archive_entry_mode(local_4fa0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'Ϫ',0x41ed,"16877",(ulong)mVar2,"archive_entry_mode(ae)",(void *)0x0);
  wVar3 = archive_entry_is_encrypted(local_4fa0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ϫ',(long)wVar3,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'Ϭ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
  iVar1 = archive_read_next_header(a,&local_4fa0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ϯ',(uint)(iVar1 == 1),"1 == archive_read_next_header(a, &ae)",a);
  iVar1 = archive_file_count(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ϰ',7,"7",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  iVar1 = archive_read_close(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ϱ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ϲ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
test_read_format_rar_multivolume_test_body_helper(struct archive *a)
{
  int file1_size = 241647978, offset = 0;
  char buff[64];
  const char file1_test_txt[] = "gin-bottom: 0in\"><BR>\n</P>\n</BODY>\n"
                                "</HTML>";
  char file2_buff[20111];
  int file2_size = sizeof(file2_buff);
  const char file2_test_txt[] = "<P STYLE=\"margin-bottom: 0in\"><BR>\n"
                                "</P>\n"
                                "</BODY>\n"
                                "</HTML>";
  char file3_buff[20];
  int file3_size = sizeof(file3_buff);
  const char file3_test_txt[] = "test text document\r\n";
  struct archive_entry *ae;

  /* First header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("ppmd_lzss_conversion_test.txt",
                    archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(file1_size, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
  while (offset + (int)sizeof(buff) < file1_size)
  {
    assertA(sizeof(buff) == archive_read_data(a, buff, sizeof(buff)));
    offset += sizeof(buff);
  }
  assertA(file1_size - offset ==
    archive_read_data(a, buff, file1_size - offset));
  assertEqualMem(buff, file1_test_txt, file1_size - offset);

  /* Second header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("LibarchiveAddingTest.html", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(file2_size, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
  assertA(file2_size == archive_read_data(a, file2_buff, file2_size));
  assertEqualMem(&file2_buff[file2_size - sizeof(file2_test_txt) + 1],
                 file2_test_txt, sizeof(file2_test_txt) - 1);

  /* Third header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testlink", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(41471, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
  assertEqualString("LibarchiveAddingTest.html", archive_entry_symlink(ae));
  assertEqualIntA(a, 0, archive_read_data(a, file2_buff, 30));

  /* Fourth header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testdir/test.txt", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(file3_size, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
  assertA(file3_size == archive_read_data(a, file3_buff, file3_size));
  assertEqualMem(&file3_buff[file3_size + 1 - sizeof(file3_test_txt)],
                 file3_test_txt, sizeof(file3_test_txt) - 1);

  /* Fifth header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testdir/LibarchiveAddingTest.html",
                    archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(file2_size, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
  assertA(file2_size == archive_read_data(a, file2_buff, file2_size));
  assertEqualMem(&file2_buff[file2_size - sizeof(file2_test_txt) + 1],
                 file2_test_txt, sizeof(file2_test_txt) - 1);

  /* Sixth header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testdir", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(16877, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

  /* Seventh header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testemptydir", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(16877, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

  /* Test EOF */
  assertA(1 == archive_read_next_header(a, &ae));
  assertEqualInt(7, archive_file_count(a));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}